

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

string_validator __thiscall goodform::sub_form::string(sub_form *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  allocator<char> local_61;
  string local_60;
  error_message local_40;
  sub_form *local_20;
  sub_form *this_local;
  
  local_20 = this;
  bVar1 = is<std::__cxx11::string>(this->variant_);
  if (bVar1) {
    value = get<std::__cxx11::string>(this->variant_);
    string_validator::string_validator((string_validator *)&this_local,value,this->error_);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"TYPE NOT STRING",&local_61);
    error_message::error_message(&local_40,&local_60);
    error_message::operator=(this->error_,&local_40);
    error_message::~error_message(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    string_validator::string_validator
              ((string_validator *)&this_local,(string *)const_string_abi_cxx11_,this->error_);
  }
  return _this_local;
}

Assistant:

string_validator sub_form::string()
  {
    if (!is<std::string>(this->variant_))
    {
      this->error_ = error_message("TYPE NOT STRING");
      return string_validator(const_string, this->error_);
    }
    else
    {
      return string_validator(get<std::string>(this->variant_), this->error_);
    }
  }